

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdSetPsbtSignature(void *handle,void *psbt_handle,char *txid,uint32_t vout,char *pubkey,
                       char *der_signature)

{
  Psbt *this;
  bool bVar1;
  CfdException *pCVar2;
  allocator local_219;
  string local_218;
  string local_1f8;
  OutPoint outpoint;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1b0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_198;
  KeyData key;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&key,"PsbtHandle",(allocator *)&outpoint);
  cfd::capi::CheckBuffer(psbt_handle,(string *)&key);
  std::__cxx11::string::~string((string *)&key);
  bVar1 = cfd::capi::IsEmptyString(txid);
  if (bVar1) {
    key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x38b;
    key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdSetPsbtSignature";
    cfd::core::logger::warn<>((CfdSourceLocation *)&key,"txid is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&key,"Failed to parameter. txid is null or empty.",(allocator *)&outpoint);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&key);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(pubkey);
  if (bVar1) {
    key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x391;
    key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdSetPsbtSignature";
    cfd::core::logger::warn<>((CfdSourceLocation *)&key,"pubkey is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&key,"Failed to parameter. pubkey is null or empty.",(allocator *)&outpoint
              );
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&key);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(der_signature);
  if (bVar1) {
    key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x397;
    key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdSetPsbtSignature";
    cfd::core::logger::warn<>((CfdSourceLocation *)&key,"der_signature is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&key,"Failed to parameter. der_signature is null or empty.",
               (allocator *)&outpoint);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&key);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)((long)psbt_handle + 0x18) != 0) {
    std::__cxx11::string::string((string *)&local_218,txid,(allocator *)&local_1f8);
    cfd::core::Txid::Txid((Txid *)&key,&local_218);
    cfd::core::OutPoint::OutPoint(&outpoint,(Txid *)&key,vout);
    cfd::core::Txid::~Txid((Txid *)&key);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::string((string *)&local_218,pubkey,&local_219);
    cfd::core::Pubkey::Pubkey((Pubkey *)&local_1b0,&local_218);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    local_1f8._M_string_length = 0;
    local_1f8.field_2._M_local_buf[0] = '\0';
    cfd::core::ByteData::ByteData((ByteData *)&local_198);
    cfd::core::KeyData::KeyData(&key,(Pubkey *)&local_1b0,&local_1f8,(ByteData *)&local_198);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_198);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1b0);
    std::__cxx11::string::~string((string *)&local_218);
    this = *(Psbt **)((long)psbt_handle + 0x18);
    std::__cxx11::string::string((string *)&local_218,der_signature,(allocator *)&local_1b0);
    cfd::core::ByteData::ByteData((ByteData *)&local_1f8,&local_218);
    cfd::Psbt::SetTxInSignature(this,&outpoint,&key,(ByteData *)&local_1f8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    cfd::core::KeyData::~KeyData(&key);
    cfd::core::Txid::~Txid(&outpoint.txid_);
    return 0;
  }
  key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
  key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x39d;
  key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "CfdSetPsbtSignature";
  cfd::core::logger::warn<>((CfdSourceLocation *)&key,"psbt is null.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&key,"Failed to handle statement. psbt is null.",(allocator *)&outpoint);
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)&key);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdSetPsbtSignature(
    void* handle, void* psbt_handle, const char* txid, uint32_t vout,
    const char* pubkey, const char* der_signature) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }
    if (IsEmptyString(der_signature)) {
      warn(CFD_LOG_SOURCE, "der_signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. der_signature is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }
    OutPoint outpoint(Txid(txid), vout);

    KeyData key = KeyData(Pubkey(pubkey), std::string(), ByteData());
    psbt_obj->psbt->SetTxInSignature(outpoint, key, ByteData(der_signature));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}